

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void __thiscall ExecutorX86::ClearBreakpoints(ExecutorX86 *this)

{
  uint uVar1;
  Breakpoint *pBVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = (this->breakInstructions).count;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pBVar2 = (this->breakInstructions).data;
      uVar1 = pBVar2[uVar5].instIndex;
      if ((this->instAddress).count <= uVar1) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<unsigned char *>::operator[](unsigned int) [T = unsigned char *, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      puVar3 = (this->instAddress).data[uVar1];
      if (*puVar3 == 0xcc) {
        *puVar3 = pBVar2[uVar5].oldOpcode;
        uVar4 = (this->breakInstructions).count;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  (this->breakInstructions).count = 0;
  return;
}

Assistant:

void ExecutorX86::ClearBreakpoints()
{
	for(unsigned i = 0; i < breakInstructions.size(); i++)
	{
		if(*instAddress[breakInstructions[i].instIndex] == 0xcc)
			*instAddress[breakInstructions[i].instIndex] = breakInstructions[i].oldOpcode;
	}
	breakInstructions.clear();
}